

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O0

void * DirectionalLight_create(void)

{
  DirectionalLight *self;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 uStack_80;
  Light *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 *local_50;
  undefined4 local_48;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  
  local_78 = (Light *)embree::alignedUSMMalloc
                                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,DEFAULT);
  embree::Light_Constructor(local_78);
  local_78->type = LIGHT_DIRECTIONAL;
  local_50 = &local_88;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0x3f800000;
  local_88 = 0;
  uStack_80 = 0x3f800000;
  local_6c = 0x3f800000;
  local_48 = 0x3f800000;
  local_68 = &stack0xffffffffffffff68;
  DirectionalLight_set
            (in_stack_ffffffffffffffd0,(Vec3fa *)CONCAT44(in_stack_ffffffffffffffcc,0x3f800000),
             (Vec3fa *)0x3f8000003f800000,1.0);
  return local_78;
}

Assistant:

void* DirectionalLight_create()
{
  DirectionalLight* self = (DirectionalLight*) alignedUSMMalloc(sizeof(DirectionalLight),16);
  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(DirectionalLight_sample);
  //self->super.eval = GET_FUNCTION_POINTER(DirectionalLight_eval);
  self->super.type = LIGHT_DIRECTIONAL;

  DirectionalLight_set(self, Vec3fa(0.f, 0.f, 1.f), Vec3fa(1.f), 1.f);
  return self;
}